

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

int VP8LGetHistoImageSymbols
              (int xsize,int ysize,VP8LBackwardRefs *refs,int quality,int low_effort,
              int histogram_bits,int cache_bits,VP8LHistogramSet *image_histo,
              VP8LHistogram *tmp_histo,uint16_t *histogram_symbols)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  VP8LHistogramSet *pVVar6;
  VP8LHistogramSet *set;
  int in_ECX;
  uint32_t in_ESI;
  uint32_t in_EDI;
  int in_R8D;
  uint32_t in_R9D;
  VP8LHistogramSet *in_stack_00000010;
  int in_stack_0000001c;
  int do_greedy;
  int threshold_size;
  float x;
  uint32_t num_clusters;
  double combine_cost_factor;
  uint16_t *bin_map;
  int num_used;
  uint16_t *cluster_mappings;
  uint16_t *map_tmp;
  int entropy_combine;
  int entropy_combine_num_bins;
  VP8LHistogramSet *orig_histo;
  int image_histo_raw_size;
  int histo_ysize;
  int histo_xsize;
  int ok;
  undefined4 in_stack_000000a4;
  uint16_t *in_stack_000000c0;
  int *in_stack_000000c8;
  VP8LHistogramSet *in_stack_000000d0;
  int in_stack_000000e0;
  int in_stack_000000e8;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  uint32_t uVar7;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int num_clusters_00;
  VP8LHistogramSet *in_stack_ffffffffffffff98;
  VP8LHistogramSet *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  VP8LHistogramSet *image_histo_00;
  int local_20;
  
  local_20 = 0;
  if (in_R9D == 0) {
    uVar7 = 1;
    uVar2 = 1;
    uVar1 = uVar7;
  }
  else {
    uVar1 = VP8LSubSampleSize(in_EDI,in_R9D);
    uVar7 = uVar1;
    uVar2 = VP8LSubSampleSize(in_ESI,in_R9D);
  }
  iVar3 = uVar1 * uVar2;
  pVVar6 = VP8LAllocateHistogramSet(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
  iVar4 = 0x40;
  if (in_R8D != 0) {
    iVar4 = 4;
  }
  set = (VP8LHistogramSet *)
        WebPSafeMalloc(CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                       CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  image_histo_00 = (VP8LHistogramSet *)((long)&set->size + (long)iVar3 * 2);
  if ((pVVar6 != (VP8LHistogramSet *)0x0) && (set != (VP8LHistogramSet *)0x0)) {
    num_clusters_00 = iVar3;
    HistogramBuild((int)((ulong)image_histo_00 >> 0x20),(int)image_histo_00,
                   (VP8LBackwardRefs *)CONCAT44(iVar3,in_stack_ffffffffffffffa8),
                   in_stack_ffffffffffffffa0);
    HistogramCopyAndAnalyze
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (uint16_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    uVar5 = (uint)((num_clusters_00 != iVar4 * 2 &&
                   SBORROW4(num_clusters_00,iVar4 * 2) == num_clusters_00 + iVar4 * -2 < 0) &&
                  in_ECX < 100);
    pVVar6 = set;
    if (uVar5 != 0) {
      in_stack_ffffffffffffff98 = (VP8LHistogramSet *)GetCombineCostFactor(iVar3,in_ECX);
      HistogramAnalyzeEntropyBin
                (image_histo_00,(uint16_t *)CONCAT44(num_clusters_00,in_stack_ffffffffffffffa8),
                 (int)((ulong)set >> 0x20));
      HistogramCombineEntropyBin
                (in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,histogram_symbols,tmp_histo,
                 (uint16_t *)image_histo,in_stack_000000e0,
                 (double)CONCAT44(in_stack_000000a4,cache_bits),in_stack_000000e8);
      OptimizeHistogramSymbols
                (set,(uint16_t *)in_stack_ffffffffffffff98,num_clusters_00,
                 (uint16_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                 (uint16_t *)CONCAT44(uVar7,uVar2));
      in_stack_ffffffffffffffa0 = set;
    }
    if ((in_R8D == 0) || (uVar5 == 0)) {
      iVar3 = HistogramCombineStochastic(_x,_do_greedy,in_stack_0000001c,&in_stack_00000010->size);
      if (iVar3 == 0) goto LAB_0018b4a4;
      if (in_stack_ffffffffffffff88 != 0) {
        RemoveEmptyHistograms(in_stack_00000010);
        iVar3 = HistogramCombineGreedy(in_stack_ffffffffffffffa0,&in_stack_ffffffffffffff98->size);
        if (iVar3 == 0) goto LAB_0018b4a4;
      }
    }
    RemoveEmptyHistograms(in_stack_00000010);
    HistogramRemap((VP8LHistogramSet *)CONCAT44(iVar4,uVar5),pVVar6,(uint16_t *)image_histo_00);
    local_20 = 1;
  }
LAB_0018b4a4:
  VP8LFreeHistogramSet((VP8LHistogramSet *)0x18b4ae);
  WebPSafeFree((void *)0x18b4b8);
  return local_20;
}

Assistant:

int VP8LGetHistoImageSymbols(int xsize, int ysize,
                             const VP8LBackwardRefs* const refs,
                             int quality, int low_effort,
                             int histogram_bits, int cache_bits,
                             VP8LHistogramSet* const image_histo,
                             VP8LHistogram* const tmp_histo,
                             uint16_t* const histogram_symbols) {
  int ok = 0;
  const int histo_xsize =
      histogram_bits ? VP8LSubSampleSize(xsize, histogram_bits) : 1;
  const int histo_ysize =
      histogram_bits ? VP8LSubSampleSize(ysize, histogram_bits) : 1;
  const int image_histo_raw_size = histo_xsize * histo_ysize;
  VP8LHistogramSet* const orig_histo =
      VP8LAllocateHistogramSet(image_histo_raw_size, cache_bits);
  // Don't attempt linear bin-partition heuristic for
  // histograms of small sizes (as bin_map will be very sparse) and
  // maximum quality q==100 (to preserve the compression gains at that level).
  const int entropy_combine_num_bins = low_effort ? NUM_PARTITIONS : BIN_SIZE;
  int entropy_combine;
  uint16_t* const map_tmp =
      WebPSafeMalloc(2 * image_histo_raw_size, sizeof(map_tmp));
  uint16_t* const cluster_mappings = map_tmp + image_histo_raw_size;
  int num_used = image_histo_raw_size;
  if (orig_histo == NULL || map_tmp == NULL) goto Error;

  // Construct the histograms from backward references.
  HistogramBuild(xsize, histogram_bits, refs, orig_histo);
  // Copies the histograms and computes its bit_cost.
  // histogram_symbols is optimized
  HistogramCopyAndAnalyze(orig_histo, image_histo, &num_used,
                          histogram_symbols);

  entropy_combine =
      (num_used > entropy_combine_num_bins * 2) && (quality < 100);

  if (entropy_combine) {
    uint16_t* const bin_map = map_tmp;
    const double combine_cost_factor =
        GetCombineCostFactor(image_histo_raw_size, quality);
    const uint32_t num_clusters = num_used;

    HistogramAnalyzeEntropyBin(image_histo, bin_map, low_effort);
    // Collapse histograms with similar entropy.
    HistogramCombineEntropyBin(image_histo, &num_used, histogram_symbols,
                               cluster_mappings, tmp_histo, bin_map,
                               entropy_combine_num_bins, combine_cost_factor,
                               low_effort);
    OptimizeHistogramSymbols(image_histo, cluster_mappings, num_clusters,
                             map_tmp, histogram_symbols);
  }

  // Don't combine the histograms using stochastic and greedy heuristics for
  // low-effort compression mode.
  if (!low_effort || !entropy_combine) {
    const float x = quality / 100.f;
    // cubic ramp between 1 and MAX_HISTO_GREEDY:
    const int threshold_size = (int)(1 + (x * x * x) * (MAX_HISTO_GREEDY - 1));
    int do_greedy;
    if (!HistogramCombineStochastic(image_histo, &num_used, threshold_size,
                                    &do_greedy)) {
      goto Error;
    }
    if (do_greedy) {
      RemoveEmptyHistograms(image_histo);
      if (!HistogramCombineGreedy(image_histo, &num_used)) {
        goto Error;
      }
    }
  }

  // Find the optimal map from original histograms to the final ones.
  RemoveEmptyHistograms(image_histo);
  HistogramRemap(orig_histo, image_histo, histogram_symbols);

  ok = 1;

 Error:
  VP8LFreeHistogramSet(orig_histo);
  WebPSafeFree(map_tmp);
  return ok;
}